

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

bool __thiscall spvtools::opt::VectorDCE::HasVectorResult(VectorDCE *this,Instruction *inst)

{
  uint32_t uVar1;
  Kind KVar2;
  IRContext *this_00;
  TypeManager *this_01;
  Type *this_02;
  Type *current_type;
  TypeManager *type_mgr;
  Instruction *inst_local;
  VectorDCE *this_local;
  
  this_00 = Pass::context((Pass *)this);
  this_01 = IRContext::get_type_mgr(this_00);
  uVar1 = opt::Instruction::type_id(inst);
  if (uVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = opt::Instruction::type_id(inst);
    this_02 = analysis::TypeManager::GetType(this_01,uVar1);
    KVar2 = analysis::Type::kind(this_02);
    if (KVar2 == kVector) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool VectorDCE::HasVectorResult(const Instruction* inst) const {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  if (inst->type_id() == 0) {
    return false;
  }

  const analysis::Type* current_type = type_mgr->GetType(inst->type_id());
  switch (current_type->kind()) {
    case analysis::Type::kVector:
      return true;
    default:
      return false;
  }
}